

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall Scene::camera(Scene *this,double x,double y,Ray *ray)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 local_38 [16];
  double local_28;
  
  dVar1 = (this->eye).y;
  (ray->org).x = (this->eye).x;
  (ray->org).y = dVar1;
  (ray->org).z = (this->eye).z;
  if (this->aperture <= 0.0) {
    dVar12 = (this->view_y).z * y + (this->view_x).z * x + (this->eye_dir).z;
    auVar9._0_8_ = y * (this->view_y).x + (this->view_x).x * x + (this->eye_dir).x;
    auVar9._8_8_ = y * (this->view_y).y + (this->view_x).y * x + (this->eye_dir).y;
    dVar1 = SQRT(dVar12 * dVar12 + auVar9._0_8_ * auVar9._0_8_ + auVar9._8_8_ * auVar9._8_8_);
    auVar11._8_4_ = SUB84(dVar1,0);
    auVar11._0_8_ = dVar1;
    auVar11._12_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar11 = divpd(auVar9,auVar11);
    (ray->dir).x = (double)auVar11._0_8_;
    (ray->dir).y = (double)auVar11._8_8_;
    (ray->dir).z = dVar12 / dVar1;
  }
  else {
    iVar4 = rand();
    dVar6 = (double)iVar4;
    dVar1 = (this->view_x).z;
    dVar2 = (this->view_x).x;
    dVar3 = (this->view_x).y;
    iVar4 = rand();
    dVar5 = (double)iVar4;
    dVar12 = this->aperture;
    auVar7._0_8_ = dVar12 * (dVar5 * (this->view_y).x + dVar6 * dVar2);
    auVar7._8_8_ = dVar12 * (dVar5 * (this->view_y).y + dVar6 * dVar3);
    local_38 = divpd(auVar7,_DAT_0010a620);
    local_28 = ((dVar5 * (this->view_y).z + dVar1 * dVar6) * dVar12) / 2147483647.0;
    Vector::operator+=(&ray->org,(Vector *)local_38);
    dVar1 = this->focus;
    local_28 = ((this->view_y).z * y + (this->view_x).z * x + (this->eye_dir).z * dVar1) - local_28;
    dVar12 = (y * (this->view_y).x + x * (this->view_x).x + dVar1 * (this->eye_dir).x) -
             (double)local_38._0_8_;
    dVar1 = (y * (this->view_y).y + x * (this->view_x).y + (this->eye_dir).y * dVar1) -
            (double)local_38._8_8_;
    auVar10._8_8_ = dVar1;
    auVar10._0_8_ = dVar12;
    auVar8._0_8_ = SQRT(local_28 * local_28 + dVar12 * dVar12 + dVar1 * dVar1);
    auVar8._8_8_ = auVar8._0_8_;
    auVar11 = divpd(auVar10,auVar8);
    (ray->dir).x = (double)auVar11._0_8_;
    (ray->dir).y = (double)auVar11._8_8_;
    (ray->dir).z = local_28 / auVar8._0_8_;
  }
  return;
}

Assistant:

void Scene::camera(double x, double y, Ray& ray)
{
    ray.org  = eye;
    if (aperture > 0.0) // камера не точечная, исп с AdaptiveDistRenderScene
    {
        // построить случайную точку на  линзе
        Vector lens_point = (view_x * (double)rand() + view_y * (double)rand()) * aperture / RAND_MAX;
        ray.org += lens_point;
        ray.dir = eye_dir * focus + view_x * x + view_y * y - lens_point;
        ray.dir = normalize(ray.dir);
    } else {
        ray.dir  = normalize(eye_dir + view_x * x + view_y * y);
    }
}